

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O0

bool __thiscall
HuffTree::HuffTree::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,
          unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *l,
          unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *r)

{
  int iVar1;
  pointer pTVar2;
  
  pTVar2 = std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::operator->
                     ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                      0x12407d);
  iVar1 = pTVar2->_freq;
  pTVar2 = std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::operator->
                     ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                      0x12408e);
  return pTVar2->_freq < iVar1;
}

Assistant:

HuffTree::HuffTree(const std::unordered_map<char, int> &data) {
    auto comp = [](const std::unique_ptr<TreeNode> &l, const std::unique_ptr<TreeNode> &r) -> bool {
        return (l->_freq > r->_freq);
    };

    std::priority_queue<std::unique_ptr<TreeNode>,
            std::vector<std::unique_ptr<TreeNode>>,
            decltype(comp)> MinHeap(comp);

    for (auto i : data) {
        MinHeap.push(std::make_unique<TreeNode>(TreeNode(i.first, i.second, nullptr, nullptr, true)));
    }
    std::size_t size = data.size();
    while (size > 1) {
        std::unique_ptr<TreeNode> l(std::move(const_cast<std::unique_ptr<TreeNode> &>(MinHeap.top())));
        MinHeap.pop();

        std::unique_ptr<TreeNode> r(std::move(const_cast<std::unique_ptr<TreeNode> &>(MinHeap.top())));
        MinHeap.pop();

        int freq = l->_freq + r->_freq;
        MinHeap.push(std::make_unique<TreeNode>(TreeNode(' ', freq, std::move(l), std::move(r), false)));
        size--;
    }
    if (!MinHeap.empty()) {
        std::unique_ptr<TreeNode> top(std::move(const_cast<std::unique_ptr<TreeNode> &>(MinHeap.top())));
        MinHeap.pop();
        if (data.size() == 1) {
            int freq = top->_freq;
            root = std::make_unique<TreeNode>(TreeNode(' ', freq, std::move(top),
                                                       nullptr, false));
        } else {
            root = std::move(const_cast<std::unique_ptr<TreeNode> &>(top));
        }
    }
}